

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O1

void __thiscall
deqp::gls::ShaderExecUtil::BufferIoExecutor::readOutputBuffer
          (BufferIoExecutor *this,void **outputPtrs,int numValues)

{
  pointer pVVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  void *srcBasePtr;
  TestError *this_00;
  long lVar5;
  pointer pSVar6;
  long lVar7;
  ulong uVar8;
  long lVar4;
  
  iVar2 = (*((this->super_ShaderExecutor).m_renderCtx)->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  pVVar1 = (this->m_outputLayout).
           super__Vector_base<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar1 == (this->m_outputLayout).
                super__Vector_base<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    dVar3 = 0;
  }
  else {
    dVar3 = pVVar1->stride;
  }
  (**(code **)(lVar4 + 0x40))(0x90d2,(this->m_outputBuffer).super_ObjectWrapper.m_object);
  srcBasePtr = (void *)(**(code **)(lVar4 + 0xd00))(0x90d2,0,(long)(int)(dVar3 * numValues),1);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glMapBufferRange()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
                  ,0x42d);
  if (srcBasePtr != (void *)0x0) {
    pSVar6 = (this->super_ShaderExecutor).m_outputs.
             super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->super_ShaderExecutor).m_outputs.
        super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
        ._M_impl.super__Vector_impl_data._M_finish != pSVar6) {
      lVar7 = 0x20;
      lVar5 = 0;
      uVar8 = 0;
      do {
        copyFromBuffer((VarType *)((long)&(pSVar6->name)._M_dataplus._M_p + lVar7),
                       (VarLayout *)
                       ((long)&((this->m_outputLayout).
                                super__Vector_base<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>
                                ._M_impl.super__Vector_impl_data._M_start)->offset + lVar5),
                       numValues,srcBasePtr,outputPtrs[uVar8]);
        uVar8 = uVar8 + 1;
        pSVar6 = (this->super_ShaderExecutor).m_outputs.
                 super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar5 = lVar5 + 0xc;
        lVar7 = lVar7 + 0x38;
      } while (uVar8 < (ulong)(((long)(this->super_ShaderExecutor).m_outputs.
                                      super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar6 >> 3
                               ) * 0x6db6db6db6db6db7));
    }
    (**(code **)(lVar4 + 0x1670))(0x90d2);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glUnmapBuffer()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
                    ,0x442);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"mapPtr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
             ,0x42e);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void BufferIoExecutor::readOutputBuffer (void* const* outputPtrs, int numValues)
{
	const glw::Functions&	gl					= m_renderCtx.getFunctions();
	const deUint32			buffer				= *m_outputBuffer;
	const deUint32			outputStride		= getLayoutStride(m_outputLayout);
	const int				outputBufferSize	= numValues*outputStride;

	DE_ASSERT(outputBufferSize > 0); // At least some outputs are required.

	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, buffer);
	void* mapPtr = gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, outputBufferSize, GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange()");
	TCU_CHECK(mapPtr);

	try
	{
		DE_ASSERT(m_outputs.size() == m_outputLayout.size());
		for (size_t outputNdx = 0; outputNdx < m_outputs.size(); ++outputNdx)
		{
			const glu::VarType&		varType		= m_outputs[outputNdx].varType;
			const VarLayout&		layout		= m_outputLayout[outputNdx];

			copyFromBuffer(varType, layout, numValues, mapPtr, outputPtrs[outputNdx]);
		}
	}
	catch (...)
	{
		gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
		throw;
	}

	gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer()");
}